

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::schema::Node::Reader> * __thiscall
capnp::compiler::Compiler::Node::getFinalSchema
          (Maybe<capnp::schema::Node::Reader> *__return_storage_ptr__,Node *this)

{
  bool bVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  SegmentReader *pSVar5;
  _func_int *p_Var6;
  _func_int *p_Var7;
  Maybe<capnp::schema::Node::Reader> *pMVar8;
  StructDataBitCount SVar9;
  StructPointerCount SVar10;
  undefined2 uVar11;
  int iVar12;
  undefined4 uVar13;
  _func_int **in_RAX;
  Content *content;
  Resolver local_18;
  
  if ((this->loadedFinalSchema).ptr.isSet == true) {
    (__return_storage_ptr__->ptr).isSet = true;
    pCVar2 = (this->loadedFinalSchema).ptr.field_1.value._reader.capTable;
    pvVar3 = (this->loadedFinalSchema).ptr.field_1.value._reader.data;
    pWVar4 = (this->loadedFinalSchema).ptr.field_1.value._reader.pointers;
    pMVar8 = &this->loadedFinalSchema;
    SVar9 = *(StructDataBitCount *)((long)&(pMVar8->ptr).field_1 + 0x20);
    SVar10 = *(StructPointerCount *)((long)&(pMVar8->ptr).field_1 + 0x24);
    uVar11 = *(undefined2 *)((long)&(pMVar8->ptr).field_1 + 0x26);
    iVar12 = *(int *)((long)&(this->loadedFinalSchema).ptr.field_1 + 0x28);
    uVar13 = *(undefined4 *)((long)&(this->loadedFinalSchema).ptr.field_1 + 0x2c);
    (__return_storage_ptr__->ptr).field_1.value._reader.segment =
         (this->loadedFinalSchema).ptr.field_1.value._reader.segment;
    (__return_storage_ptr__->ptr).field_1.value._reader.capTable = pCVar2;
    (__return_storage_ptr__->ptr).field_1.value._reader.data = pvVar3;
    (__return_storage_ptr__->ptr).field_1.value._reader.pointers = pWVar4;
    *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = SVar9;
    *(StructPointerCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x24) = SVar10;
    *(undefined2 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x26) = uVar11;
    *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = iVar12;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x2c) = uVar13;
  }
  else {
    local_18._vptr_Resolver = in_RAX;
    getContent((Node *)&stack0xffffffffffffffe8,(State)this);
    if (local_18._vptr_Resolver == (_func_int **)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      bVar1 = *(bool *)(local_18._vptr_Resolver + 0x14);
      (__return_storage_ptr__->ptr).isSet = bVar1;
      if (bVar1 == true) {
        pSVar5 = (SegmentReader *)local_18._vptr_Resolver[0x15];
        pCVar2 = (CapTableReader *)local_18._vptr_Resolver[0x16];
        p_Var6 = local_18._vptr_Resolver[0x17];
        pWVar4 = (WirePointer *)local_18._vptr_Resolver[0x18];
        p_Var7 = local_18._vptr_Resolver[0x1a];
        *(_func_int **)&(__return_storage_ptr__->ptr).field_1.value._reader.dataSize =
             local_18._vptr_Resolver[0x19];
        *(_func_int **)&(__return_storage_ptr__->ptr).field_1.value._reader.nestingLimit = p_Var7;
        (__return_storage_ptr__->ptr).field_1.value._reader.data = p_Var6;
        (__return_storage_ptr__->ptr).field_1.value._reader.pointers = pWVar4;
        (__return_storage_ptr__->ptr).field_1.value._reader.segment = pSVar5;
        (__return_storage_ptr__->ptr).field_1.value._reader.capTable = pCVar2;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Node::Reader> Compiler::Node::getFinalSchema() {
  KJ_IF_SOME(schema, loadedFinalSchema) {
    return schema;
  } else KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    return content.finalSchema;
  } else {
    return kj::none;
  }
}